

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

DBGPROP_ATTRIB_FLAGS __thiscall
Js::RecyclableObjectDisplay::GetTypeAttribute(RecyclableObjectDisplay *this)

{
  Type TVar1;
  JavascriptString *pJVar2;
  Var pvVar3;
  ScriptContext *scriptContext;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  JavascriptString *pJVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  
  uVar13 = this->defaultAttributes;
  bVar5 = VarIs<Js::RecyclableObject>(this->instance);
  if (!bVar5) goto LAB_008b3ab6;
  pJVar2 = (JavascriptString *)this->instance;
  pJVar8 = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString
                     ((this->scriptContext->super_ScriptContextBase).javascriptLibrary);
  if (pJVar2 == pJVar8) {
    uVar13 = uVar13 | 8;
    goto LAB_008b3ab6;
  }
  pvVar3 = this->instance;
  if (pvVar3 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_008b3b75;
    *puVar9 = 0;
LAB_008b35f7:
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_008b3b75;
      *puVar9 = 0;
    }
    TVar1 = ((pRVar10->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Function) {
        uVar13 = uVar13 | 0x100;
        goto LAB_008b3ab6;
      }
    }
    else {
      BVar6 = RecyclableObject::IsExternal(pRVar10);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        pcVar15 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar11 = "GetTypeId aValue has invalid TypeId";
        uVar14 = 0xe;
        goto LAB_008b36e7;
      }
    }
  }
  else if (((ulong)pvVar3 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar3 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)pvVar3 >> 0x32 == 0 && ((ulong)pvVar3 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_008b35f7;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar14 = 0x2a;
LAB_008b36e7:
    bVar5 = Throw::ReportAssert(pcVar15,uVar14,pcVar12,pcVar11);
    if (!bVar5) goto LAB_008b3b75;
    *puVar9 = 0;
  }
  pvVar3 = this->instance;
  if (pvVar3 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_008b3b75;
    *puVar9 = 0;
LAB_008b37f4:
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_008b3b75;
      *puVar9 = 0;
    }
    TVar1 = ((pRVar10->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar6 = RecyclableObject::IsExternal(pRVar10);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        pcVar15 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar11 = "GetTypeId aValue has invalid TypeId";
        uVar14 = 0xe;
        goto LAB_008b38e0;
      }
      goto LAB_008b38fe;
    }
    if (TVar1 != TypeIds_String) goto LAB_008b38fe;
LAB_008b3a4d:
    uVar13 = uVar13 | 0x400;
  }
  else {
    if (((ulong)pvVar3 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar3 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar3 >> 0x32 == 0 && ((ulong)pvVar3 & 0xffff000000000000) != 0x1000000000000)
      goto LAB_008b37f4;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar14 = 0x2a;
LAB_008b38e0:
      bVar5 = Throw::ReportAssert(pcVar15,uVar14,pcVar12,pcVar11);
      if (!bVar5) goto LAB_008b3b75;
      *puVar9 = 0;
    }
LAB_008b38fe:
    pvVar3 = this->instance;
    if (pvVar3 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_008b3b75;
      *puVar9 = 0;
LAB_008b39d7:
      pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
      if (pRVar10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_008b3b75;
        *puVar9 = 0;
      }
      TVar1 = ((pRVar10->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 != TypeIds_StringObject) goto LAB_008b3ab6;
        goto LAB_008b3a4d;
      }
      BVar6 = RecyclableObject::IsExternal(pRVar10);
      if (BVar6 != 0) goto LAB_008b3ab6;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
      pcVar11 = "GetTypeId aValue has invalid TypeId";
      uVar14 = 0xe;
    }
    else {
      if (((ulong)pvVar3 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pvVar3 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar3 >> 0x32 != 0 || ((ulong)pvVar3 & 0xffff000000000000) == 0x1000000000000)
        goto LAB_008b3ab6;
        goto LAB_008b39d7;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar14 = 0x2a;
    }
    bVar5 = Throw::ReportAssert(pcVar15,uVar14,pcVar12,pcVar11);
    if (!bVar5) {
LAB_008b3b75:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
LAB_008b3ab6:
  scriptContext = this->scriptContext;
  if (scriptContext->threadContext->isScriptActive == false) {
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
               unaff_retaddr,&stack0x00000000,false,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
    if (this->pObjAddress != (IDiagObjectAddress *)0x0) {
      iVar7 = (*this->pObjAddress->_vptr_IDiagObjectAddress[1])();
      if (iVar7 == 0) {
        uVar13 = uVar13 | 0x800;
      }
    }
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
  }
  else if (this->pObjAddress != (IDiagObjectAddress *)0x0) {
    iVar7 = (*this->pObjAddress->_vptr_IDiagObjectAddress[1])();
    if (iVar7 == 0) {
      uVar13 = uVar13 | 0x800;
    }
  }
  return uVar13;
}

Assistant:

DBGPROP_ATTRIB_FLAGS RecyclableObjectDisplay::GetTypeAttribute()
    {
        DBGPROP_ATTRIB_FLAGS flag = defaultAttributes;

        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            if (instance == scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString())
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_INVALID;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_METHOD;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_String
                || JavascriptOperators::GetTypeId(instance) == TypeIds_StringObject)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_RAW_STRING;
            }
        }

        auto checkWriteableFunction = [&]()
        {
            if (pObjAddress && !pObjAddress->IsWritable())
            {
                flag |= DBGPROP_ATTRIB_VALUE_READONLY;
            }
        };

        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                checkWriteableFunction();
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            checkWriteableFunction();
        }
        // TODO : need to identify Events explicitly for fastDOM

        return flag;
    }